

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CreateCharacterState.cpp
# Opt level: O0

void __thiscall
CreateCharacterState::processConfirmCharacter
          (CreateCharacterState *this,string *input,shared_ptr<Connection> *connection)

{
  bool bVar1;
  element_type *peVar2;
  element_type *peVar3;
  string *psVar4;
  string *__args_3;
  element_type *this_00;
  element_type *peVar5;
  element_type *this_01;
  shared_ptr<Connection> local_190;
  GameStates local_17a;
  string local_178 [32];
  string local_158 [32];
  shared_ptr<Player> local_138;
  undefined1 local_128 [64];
  undefined1 local_e8 [20];
  int local_d4;
  undefined1 local_d0 [8];
  shared_ptr<Player> player;
  undefined1 local_a0 [8];
  shared_ptr<Race> character_race;
  string local_80 [32];
  Tokenizer local_60 [32];
  string local_40 [8];
  string command;
  shared_ptr<Connection> *connection_local;
  string *input_local;
  CreateCharacterState *this_local;
  
  std::__cxx11::string::string(local_40,(string *)input);
  std::__cxx11::string::string(local_80,(string *)input);
  Tokenizer::LowerCase(local_60,(string *)local_80);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string(local_80);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_40,"y");
  if (!bVar1) {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_40,"yes");
    if (!bVar1) {
      std::shared_ptr<Connection>::shared_ptr(&local_190,connection);
      (*(this->super_GameState)._vptr_GameState[1])(this,&local_190);
      std::shared_ptr<Connection>::~shared_ptr(&local_190);
      goto LAB_0020d025;
    }
  }
  peVar2 = std::__shared_ptr_access<GameData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<GameData,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &(this->super_GameState).game_data);
  peVar3 = std::__shared_ptr_access<Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      connection);
  psVar4 = Connection::GetCharacterRace_abi_cxx11_(peVar3);
  std::__cxx11::string::string
            ((string *)&player.super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (string *)psVar4);
  GameData::GetRace((GameData *)local_a0,(string *)peVar2);
  std::__cxx11::string::~string
            ((string *)&player.super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  peVar3 = std::__shared_ptr_access<Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      connection);
  local_d4 = Connection::GetID(peVar3);
  peVar3 = std::__shared_ptr_access<Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      connection);
  psVar4 = Connection::GetCharacterName_abi_cxx11_(peVar3);
  peVar3 = std::__shared_ptr_access<Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      connection);
  __args_3 = Connection::GetCharacterClass_abi_cxx11_(peVar3);
  this_00 = std::__shared_ptr_access<Race,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<Race,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       local_a0);
  Race::getRace_name_abi_cxx11_(this_00);
  std::
  make_shared<Player,int,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&>
            ((int *)local_d0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d4,psVar4,
             __args_3);
  peVar5 = std::__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_d0);
  Player::SetStrength(peVar5,this->m_str);
  peVar5 = std::__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_d0);
  Player::SetEndurance(peVar5,this->m_end);
  peVar5 = std::__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_d0);
  Player::SetIntelligence(peVar5,this->m_int);
  peVar5 = std::__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_d0);
  Player::SetDexterity(peVar5,this->m_dex);
  peVar5 = std::__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_d0);
  Player::SetSkill(peVar5,this->m_skill);
  peVar5 = std::__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_d0);
  Player::SetAttributePoints(peVar5,this->m_att_points);
  peVar5 = std::__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_d0);
  peVar2 = std::__shared_ptr_access<GameData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<GameData,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &(this->super_GameState).game_data);
  this_01 = std::__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       local_d0);
  psVar4 = Player::GetPlayerRaceStr_abi_cxx11_(this_01);
  std::__cxx11::string::string((string *)(local_128 + 0x20),(string *)psVar4);
  GameData::GetRace((GameData *)local_e8,(string *)peVar2);
  Player::SetPlayerRace(peVar5,(shared_ptr<Race> *)local_e8);
  std::shared_ptr<Race>::~shared_ptr((shared_ptr<Race> *)local_e8);
  std::__cxx11::string::~string((string *)(local_128 + 0x20));
  peVar5 = std::__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_d0);
  Player::SetCredits(peVar5,50000);
  peVar2 = std::__shared_ptr_access<GameData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<GameData,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &(this->super_GameState).game_data);
  std::__shared_ptr_access<Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)connection
            );
  Connection::GetUsername_abi_cxx11_((Connection *)local_128);
  std::shared_ptr<Player>::shared_ptr(&local_138,(shared_ptr<Player> *)local_d0);
  GameData::AddCharacter(peVar2,(string *)local_128,&local_138);
  std::shared_ptr<Player>::~shared_ptr(&local_138);
  std::__cxx11::string::~string((string *)local_128);
  peVar2 = std::__shared_ptr_access<GameData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<GameData,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &(this->super_GameState).game_data);
  std::__cxx11::string::string(local_158,(string *)GameData::CHARACTER_FILE_abi_cxx11_);
  GameData::SaveCharacters(peVar2,(string *)local_158);
  std::__cxx11::string::~string(local_158);
  peVar2 = std::__shared_ptr_access<GameData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<GameData,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &(this->super_GameState).game_data);
  std::__cxx11::string::string(local_178,(string *)GameData::ACCOUNT_FILE_abi_cxx11_);
  GameData::SaveAccounts(peVar2,(string *)local_178);
  std::__cxx11::string::~string(local_178);
  peVar3 = std::__shared_ptr_access<Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      connection);
  Connection::SetPlayer(peVar3,(shared_ptr<Player> *)local_d0);
  peVar3 = std::__shared_ptr_access<Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      connection);
  local_17a = PLAYING;
  Connection::SetState(peVar3,&local_17a,&(this->super_GameState).game_data);
  std::shared_ptr<Player>::~shared_ptr((shared_ptr<Player> *)local_d0);
  std::shared_ptr<Race>::~shared_ptr((shared_ptr<Race> *)local_a0);
LAB_0020d025:
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void CreateCharacterState::processConfirmCharacter(const std::string &input, std::shared_ptr<Connection> connection) {
    std::string command = input;
    Tokenizer::LowerCase(input);
    if(command == "y" or command == "yes") {
        auto character_race = game_data->GetRace(connection->GetCharacterRace());
        std::shared_ptr<Player> player = std::make_shared<Player>(connection->GetID(), connection->GetCharacterName(),
                                                                  connection->GetCharacterClass(), character_race->getRace_name());
        player->SetStrength(m_str);
        player->SetEndurance(m_end);
        player->SetIntelligence(m_int);
        player->SetDexterity(m_dex);
        player->SetSkill(m_skill);
        player->SetAttributePoints(m_att_points);
        player->SetPlayerRace(game_data->GetRace(player->GetPlayerRaceStr()));
        player->SetCredits(50000);
        game_data->AddCharacter(connection->GetUsername(), player);
        game_data->SaveCharacters(GameData::CHARACTER_FILE);
        game_data->SaveAccounts(GameData::ACCOUNT_FILE);
        connection->SetPlayer(player);
        connection->SetState(GameStates::PLAYING, game_data);
    }
    else
        init(connection);
}